

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

string * __thiscall
cmMakefile::GetModulesFile
          (string *__return_storage_ptr__,cmMakefile *this,string *filename,bool *system,bool debug,
          string *debugBuffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  cmValue cVar5;
  string *psVar6;
  ostream *poVar7;
  PolicyID id;
  cmMakefile *this_00;
  undefined3 in_register_00000081;
  pointer pbVar8;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string itempl;
  string moduleInCMakeRoot;
  string moduleInCMakeModulePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  ostringstream e;
  string local_270;
  undefined4 local_24c;
  cmMakefile *local_248;
  string local_240;
  string local_220;
  bool *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  string *local_1f0;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  string *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  undefined8 local_178;
  char *local_170;
  ios_base local_138 [264];
  
  local_24c = CONCAT31(in_register_00000081,debug);
  local_1f8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1f8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = '\0';
  local_1a8._0_8_ = local_198;
  local_200 = system;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MODULE_PATH","");
  local_248 = this;
  cVar5 = GetDefinition(this,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
  }
  if (cVar5.Value != (string *)0x0) {
    arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar5.Value)->_M_string_length;
    local_1f0 = debugBuffer;
    cmExpandedList_abi_cxx11_(&local_1c0,arg,false);
    if (local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar8 = local_1c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1c8 = filename;
      do {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        pcVar2 = (pbVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,pcVar2,pcVar2 + pbVar8->_M_string_length);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_270);
        std::__cxx11::string::append((char *)&local_270);
        std::__cxx11::string::_M_append((char *)&local_270,(ulong)(filename->_M_dataplus)._M_p);
        bVar3 = cmsys::SystemTools::FileExists(&local_270);
        psVar6 = local_1f0;
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)&local_1e8);
        }
        else if ((char)local_24c != '\0') {
          local_1a8._8_8_ = (local_1f0->_M_dataplus)._M_p;
          local_1a8._0_8_ = local_1f0->_M_string_length;
          local_198._0_8_ = 2;
          local_198._8_8_ = (long)"Resource spec file:\n\n  " + 0x15;
          local_188 = local_270._M_string_length;
          local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p;
          local_178 = 1;
          local_170 = "\n";
          views._M_len = 4;
          views._M_array = (iterator)local_1a8;
          cmCatViews_abi_cxx11_(&local_220,views);
          std::__cxx11::string::operator=((string *)psVar6,(string *)&local_220);
          filename = local_1c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
            filename = local_1c8;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        pbVar8 = pbVar8 + 1;
      } while (!bVar3 && pbVar8 != local_1c0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    debugBuffer = local_1f0;
  }
  psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_1a8._8_8_ = (psVar6->_M_dataplus)._M_p;
  local_1a8._0_8_ = psVar6->_M_string_length;
  local_198._0_8_ = 9;
  local_198._8_8_ = "/Modules/";
  local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(filename->_M_dataplus)._M_p;
  local_188 = filename->_M_string_length;
  views_00._M_len = 3;
  views_00._M_array = (iterator)local_1a8;
  cmCatViews_abi_cxx11_(&local_270,views_00);
  std::__cxx11::string::operator=((string *)&local_240,(string *)&local_270);
  paVar1 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_240);
  this_00 = local_248;
  bVar3 = cmsys::SystemTools::FileExists(&local_240);
  if (!bVar3) {
    if ((char)local_24c != '\0') {
      local_1a8._8_8_ = (debugBuffer->_M_dataplus)._M_p;
      local_1a8._0_8_ = debugBuffer->_M_string_length;
      local_198._0_8_ = 2;
      local_198._8_8_ = (long)"Resource spec file:\n\n  " + 0x15;
      local_188 = local_240._M_string_length;
      local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p;
      local_178 = 1;
      local_170 = "\n";
      views_01._M_len = 4;
      views_01._M_array = (iterator)local_1a8;
      cmCatViews_abi_cxx11_(&local_270,views_01);
      std::__cxx11::string::operator=((string *)debugBuffer,(string *)&local_270);
      this_00 = local_248;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        this_00 = local_248;
      }
    }
    local_240._M_string_length = 0;
    *local_240._M_dataplus._M_p = '\0';
  }
  *local_200 = false;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (__return_storage_ptr__->_M_string_length == 0) {
    *local_200 = true;
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((local_1e0 == 0) || (local_240._M_string_length == 0)) goto LAB_002a835b;
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_CURRENT_LIST_FILE","");
  cVar5 = GetDefinition(this_00,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
  }
  psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  local_270._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar2,pcVar2 + psVar6->_M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  if ((cVar5.Value != (string *)0x0) &&
     (bVar3 = cmsys::SystemTools::IsSubDirectory(cVar5.Value,&local_270), bVar3)) {
    PVar4 = cmStateSnapshot::GetPolicy(&local_248->StateSnapshot,CMP0017,false);
    if (PVar4 - NEW < 3) {
      bVar3 = true;
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_002a8344;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"File ",5);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,((cVar5.Value)->_M_dataplus)._M_p,
                            (cVar5.Value)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," includes ",10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1e8,local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," (found via CMAKE_MODULE_PATH) which shadows ",0x2d);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_240._M_dataplus._M_p,local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,". This may cause errors later on .\n",0x23);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_220,(cmPolicies *)&DAT_00000011,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,local_220._M_dataplus._M_p,local_220._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(local_248->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_220,
                            &local_248->Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      bVar3 = false;
    }
    *local_200 = bVar3;
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
LAB_002a8344:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
LAB_002a835b:
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const std::string& filename,
                                       bool& system, bool debug,
                                       std::string& debugBuffer) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  cmValue cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath = cmExpandedList(*cmakeModulePath);

    // Look through the possible module directories.
    for (std::string itempl : modulePath) {
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl)) {
        moduleInCMakeModulePath = itempl;
        break;
      }
      if (debug) {
        debugBuffer = cmStrCat(debugBuffer, "  ", itempl, "\n");
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules/", filename);
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot)) {
    if (debug) {
      debugBuffer = cmStrCat(debugBuffer, "  ", moduleInCMakeRoot, "\n");
    }
    moduleInCMakeRoot.clear();
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  system = false;
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    system = true;
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    cmValue currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(*currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << *currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          system = false;
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          system = true;
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}